

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menuinput.cpp
# Opt level: O1

bool __thiscall DTextEnterMenu::Responder(DTextEnterMenu *this,event_t *ev)

{
  BYTE BVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  _func_int **pp_Var5;
  uint uVar6;
  undefined8 uVar7;
  DMenu *pDVar8;
  
  if (ev->type != '\x04') goto LAB_003115df;
  BVar1 = ev->subtype;
  if (BVar1 == '\x04') {
    this->mInputGridOkay = false;
    if (this->mEnterSize <= this->mEnterPos) {
      return true;
    }
    if ((this->mSizeMode != 2) &&
       (iVar4 = FFont::StringWidth(SmallFont,(BYTE *)this->mEnterString),
       (ulong)(this->mEnterSize * 8 - 8) <= (ulong)(long)iVar4)) {
      return true;
    }
    this->mEnterString[this->mEnterPos] = (char)ev->data1;
    uVar6 = this->mEnterPos + 1;
    this->mEnterPos = uVar6;
    this->mEnterString[uVar6] = '\0';
    return true;
  }
  cVar2 = (char)ev->data1;
  if (BVar1 == '\x01') {
    if (cVar2 == '\b') goto LAB_003115c1;
LAB_0031156c:
    if (BVar1 == '\x01') {
      if (cVar2 == '\r') {
        if (*this->mEnterString != '\0') {
          if (this->AllowColors == true) {
            strbin(this->mEnterString);
          }
          pDVar8 = (this->super_DMenu).mParentMenu.field_0.p;
          if ((pDVar8 != (DMenu *)0x0) && (((pDVar8->super_DObject).ObjectFlags & 0x20) != 0)) {
            (this->super_DMenu).mParentMenu.field_0.p = (DMenu *)0x0;
            pDVar8 = (DMenu *)0x0;
          }
          (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])(this);
          pp_Var5 = (pDVar8->super_DObject)._vptr_DObject;
          uVar7 = 10;
          goto LAB_00311634;
        }
      }
      else if (cVar2 == '\x1b') {
        pDVar8 = (this->super_DMenu).mParentMenu.field_0.p;
        if ((pDVar8 != (DMenu *)0x0) && (((pDVar8->super_DObject).ObjectFlags & 0x20) != 0)) {
          (this->super_DMenu).mParentMenu.field_0.p = (DMenu *)0x0;
          pDVar8 = (DMenu *)0x0;
        }
        (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])(this);
        pp_Var5 = (pDVar8->super_DObject)._vptr_DObject;
        uVar7 = 0xb;
LAB_00311634:
        (*pp_Var5[8])(pDVar8,uVar7,0);
        return true;
      }
    }
  }
  else {
    if (cVar2 != '\b' || BVar1 != '\x02') goto LAB_0031156c;
LAB_003115c1:
    if (this->mEnterPos != 0) {
      uVar6 = this->mEnterPos - 1;
      this->mEnterPos = uVar6;
      this->mEnterString[uVar6] = '\0';
    }
  }
  if (0xfd < (byte)(ev->subtype - 3)) {
    return true;
  }
LAB_003115df:
  bVar3 = DMenu::Responder(&this->super_DMenu,ev);
  return bVar3;
}

Assistant:

bool DTextEnterMenu::Responder(event_t *ev)
{
	if (ev->type == EV_GUI_Event)
	{
		// Save game and player name string input
		if (ev->subtype == EV_GUI_Char)
		{
			mInputGridOkay = false;
			if (mEnterPos < mEnterSize &&
				(mSizeMode == 2/*entering player name*/ || (size_t)SmallFont->StringWidth(mEnterString) < (mEnterSize-1)*8))
			{
				mEnterString[mEnterPos] = (char)ev->data1;
				mEnterString[++mEnterPos] = 0;
			}
			return true;
		}
		char ch = (char)ev->data1;
		if ((ev->subtype == EV_GUI_KeyDown || ev->subtype == EV_GUI_KeyRepeat) && ch == '\b')
		{
			if (mEnterPos > 0)
			{
				mEnterPos--;
				mEnterString[mEnterPos] = 0;
			}
		}
		else if (ev->subtype == EV_GUI_KeyDown)
		{
			if (ch == GK_ESCAPE)
			{
				DMenu *parent = mParentMenu;
				Close();
				parent->MenuEvent(MKEY_Abort, false);
				return true;
			}
			else if (ch == '\r')
			{
				if (mEnterString[0])
				{
					// [TP] If we allow color codes, colorize the string now.
					if (AllowColors)
						strbin(mEnterString);

					DMenu *parent = mParentMenu;
					Close();
					parent->MenuEvent(MKEY_Input, false);
					return true;
				}
			}
		}
		if (ev->subtype == EV_GUI_KeyDown || ev->subtype == EV_GUI_KeyRepeat)
		{
			return true;
		}
	}
	return Super::Responder(ev);
}